

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::key_question(Forth *this)

{
  long lVar1;
  Cell local_28;
  Cell local_24;
  Cell local_14;
  Cell flag;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"KEY?");
  local_14 = 0;
  if (this->readFromSource == FromString) {
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
    std::__cxx11::stringstream::rdbuf();
    lVar1 = std::streambuf::in_avail();
    if (lVar1 < 1) {
      local_24 = this->False;
    }
    else {
      local_24 = this->True;
    }
    local_14 = local_24;
  }
  else if (this->readFromSource == FromStdCin) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1c6650);
    std::istream::sync();
    std::ios_base::sync_with_stdio(true);
    std::ios::rdbuf();
    std::streambuf::pubsync();
    std::ios::rdbuf();
    lVar1 = std::streambuf::in_avail();
    if (lVar1 < 1) {
      local_28 = this->False;
    }
    else {
      local_28 = this->True;
    }
    local_14 = local_28;
  }
  push(this,local_14);
  return;
}

Assistant:

void key_question() {
			REQUIRE_DSTACK_AVAILABLE(1, "KEY?");
			Cell flag{} ;
			switch (readFromSource) {
				case FromString:
					std_cin.clear();
					flag = std_cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				case FromStdCin:
					std::cin.clear(); // clear previous error codes
					std::cin.sync();
					std::cin.sync_with_stdio(true);
					std::cin.rdbuf()->pubsync();
					flag = std::cin.rdbuf()->in_avail() > 0 ? True : False;
					break;
				default:
					break;
			}
			push(flag);
		}